

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

DynamicType * __thiscall
Js::JavascriptLibrary::CreateAsyncGeneratorType(JavascriptLibrary *this,RecyclableObject *prototype)

{
  ScriptContext *scriptContext;
  ScriptContext **ppSVar1;
  DynamicTypeHandler *typeHandler;
  DynamicType *pDVar2;
  RecyclableObject *prototype_local;
  JavascriptLibrary *this_local;
  
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  scriptContext = *ppSVar1;
  typeHandler = (DynamicTypeHandler *)NullTypeHandler<false>::GetDefaultInstance();
  pDVar2 = DynamicType::New(scriptContext,TypeIds_AsyncGenerator,prototype,(JavascriptMethod)0x0,
                            typeHandler,false,false);
  return pDVar2;
}

Assistant:

DynamicType* JavascriptLibrary::CreateAsyncGeneratorType(RecyclableObject* prototype)
    {
        return DynamicType::New(
            scriptContext,
            TypeIds_AsyncGenerator,
            prototype,
            nullptr,
            NullTypeHandler<false>::GetDefaultInstance());
    }